

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

ostream * __thiscall dynamicgraph::Entity::writeCompletionList(Entity *this,ostream *os)

{
  bool bVar1;
  pointer ppVar2;
  string *psVar3;
  ostream *poVar4;
  string local_48;
  _Self local_28;
  const_iterator iter;
  const_iterator iterend;
  ostream *os_local;
  Entity *this_local;
  
  iter = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::SignalBase<int>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::SignalBase<int>_*>_>_>
         ::end(&this->signalMap);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::SignalBase<int>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::SignalBase<int>_*>_>_>
       ::begin(&this->signalMap);
  while( true ) {
    bVar1 = std::operator!=(&iter,&local_28);
    if (!bVar1) break;
    psVar3 = getName_abi_cxx11_(this);
    poVar4 = std::operator<<(os,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,".");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::SignalBase<int>_*>_>
             ::operator->(&local_28);
    SignalBase<int>::shortName_abi_cxx11_(&local_48,ppVar2->second);
    poVar4 = std::operator<<(poVar4,(string *)&local_48);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_48);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::SignalBase<int>_*>_>
    ::operator++(&local_28);
  }
  psVar3 = getCommandList_abi_cxx11_(this);
  poVar4 = std::operator<<(os,(string *)psVar3);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return os;
}

Assistant:

std::ostream &Entity::writeCompletionList(std::ostream &os) const {
  const SignalMap::const_iterator iterend = signalMap.end();
  for (SignalMap::const_iterator iter = signalMap.begin(); iterend != iter;
       ++iter) {
    os << getName() << "." << (*(iter->second)).shortName() << std::endl;
  }

  os << getCommandList() << std::endl;
  return os;
}